

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

floatx80 int64_to_floatx80_sparc(int64_t a,float_status *status)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  floatx80 fVar5;
  
  if (a == 0) {
    lVar3 = 0;
    iVar4 = 0;
  }
  else {
    uVar2 = -a;
    if (0 < a) {
      uVar2 = a;
    }
    uVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    lVar3 = uVar2 << ((byte)(uVar1 ^ 0x3f) & 0x3f);
    iVar4 = (((ushort)((ulong)a >> 0x30) & 0x8000) - (int)(uVar1 ^ 0x3f)) + 0x403e;
  }
  fVar5._8_4_ = iVar4;
  fVar5.low = lVar3;
  fVar5._12_4_ = 0;
  return fVar5;
}

Assistant:

floatx80 int64_to_floatx80(int64_t a, float_status *status)
{
    flag zSign;
    uint64_t absA;
    int8_t shiftCount;

    if ( a == 0 ) return packFloatx80( 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz64(absA);
    return packFloatx80( zSign, 0x403E - shiftCount, absA<<shiftCount );

}